

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O3

void __thiscall
cpplog::ConsoleLogger::logMessage
          (ConsoleLogger *this,Level level,wstring *local,time_point timestamp)

{
  bool bVar1;
  int iVar2;
  wostream *pwVar3;
  undefined8 uVar4;
  mutex *__mutex;
  undefined7 in_register_00000031;
  Logger *pLVar5;
  wstring local_68;
  string local_48;
  
  pLVar5 = (Logger *)CONCAT71(in_register_00000031,level);
  bVar1 = Logger::willBeLogged(&this->super_Logger,level);
  if (bVar1) {
    __mutex = &(this->super_Logger).writeLock;
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar2 != 0) {
      uVar4 = std::__throw_system_error(iVar2);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Unwind_Resume(uVar4);
    }
    if ((level == SEVERE) || (level == ERROR)) {
      Logger::toString_abi_cxx11_(&local_68,pLVar5,level);
      pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                         ((wostream *)&std::wcerr,local_68._M_dataplus._M_p,
                          local_68._M_string_length);
      pLVar5 = (Logger *)0x106073;
      pwVar3 = std::operator<<(pwVar3," ");
      Logger::toString_abi_cxx11_(&local_48,pLVar5,timestamp);
      pwVar3 = operator<<(pwVar3,&local_48);
      pwVar3 = std::operator<<(pwVar3,": ");
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                (pwVar3,(local->_M_dataplus)._M_p,local->_M_string_length);
    }
    else {
      Logger::toString_abi_cxx11_(&local_68,pLVar5,level);
      pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                         ((wostream *)&std::wcout,local_68._M_dataplus._M_p,
                          local_68._M_string_length);
      pLVar5 = (Logger *)0x106073;
      pwVar3 = std::operator<<(pwVar3," ");
      Logger::toString_abi_cxx11_(&local_48,pLVar5,timestamp);
      pwVar3 = operator<<(pwVar3,&local_48);
      pwVar3 = std::operator<<(pwVar3,": ");
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                (pwVar3,(local->_M_dataplus)._M_p,local->_M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return;
}

Assistant:

void ConsoleLogger::logMessage(Level level, const std::wstring& local, std::chrono::system_clock::time_point timestamp)
{
    if(!willBeLogged(level))
        return;
    std::lock_guard<std::mutex> guard(writeLock);
    if(level == Level::ERROR || level == Level::SEVERE)
        std::wcerr << toString(level) << " " << toString(timestamp) << ": " << local;
    else
        std::wcout << toString(level) << " " << toString(timestamp) << ": " << local;
}